

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.H
# Opt level: O2

void __thiscall String::String(String *this,char *s,bool nc)

{
  allocator local_39;
  string local_38;
  
  (this->super_string)._M_dataplus._M_p = (pointer)&(this->super_string).field_2;
  (this->super_string)._M_string_length = 0;
  (this->super_string).field_2._M_local_buf[0] = '\0';
  this->_noCase = nc;
  this->_no = false;
  this->_list = false;
  if (s == (char *)0x0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)&local_38,s,&local_39);
  }
  setValue(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

inline String(char const * s, bool nc = false)
        : _noCase(nc)
        , _no(false)
        , _list(false)
    {
        setValue(s != nullptr ? std::string(s) : std::string());
    }